

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

char parity_to_text(parity p)

{
  type tVar1;
  parity local_10;
  char local_9;
  parity p_local;
  
  local_10.value_ = p.value_;
  tVar1 = boost::asio::serial_port_base::parity::value(&local_10);
  if (tVar1 == none) {
    local_9 = 'N';
  }
  else if (tVar1 == odd) {
    local_9 = 'O';
  }
  else {
    if (tVar1 != even) {
      __assert_fail("!\"can\'t be\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface.cpp"
                    ,0x51,"char parity_to_text(boost::asio::serial_port_base::parity)");
    }
    local_9 = 'E';
  }
  return local_9;
}

Assistant:

char parity_to_text( boost::asio::serial_port_base::parity p )
{
    using type = boost::asio::serial_port_base::parity::type;

    switch ( p.value() )
    {
        case type::none:
            return 'N';
        case type::odd:
            return 'O';
        case type::even:
            return 'E';
    }

    assert( !"can't be" );
}